

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmObjByteArray::getp_length(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  
  if (getp_length(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_length();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_length::desc);
  if (iVar2 == 0) {
    vVar1 = *(vm_obj_id_t *)(this->super_CVmObject).ext_;
    retval->typ = VM_INT;
    (retval->val).obj = vVar1;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_length(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the length */
    retval->set_int(get_element_count());

    /* handled */
    return TRUE;
}